

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O2

void highbd_blend_a64_d16_mask_w16_avx2
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,__m256i *mask0a,__m256i *mask0b,__m256i *round_offset,int shift,
               __m256i *clip_low,__m256i *clip_high,__m256i *mask_max)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  alVar1 = *mask0a;
  auVar5 = vpsubw_avx2((undefined1  [32])*mask_max,(undefined1  [32])alVar1);
  alVar2 = *mask0b;
  auVar6 = vpsubw_avx2((undefined1  [32])*mask_max,(undefined1  [32])alVar2);
  auVar3 = vpmulhuw_avx2((undefined1  [32])alVar1,*(undefined1 (*) [32])src0);
  auVar4 = vpmullw_avx2((undefined1  [32])alVar1,*(undefined1 (*) [32])src0);
  auVar7 = vpunpckhwd_avx2(auVar4,auVar3);
  auVar8 = vpunpcklwd_avx2(auVar4,auVar3);
  auVar4 = vpmulhuw_avx2(auVar5,*(undefined1 (*) [32])src1);
  auVar5 = vpmullw_avx2(auVar5,*(undefined1 (*) [32])src1);
  auVar3 = vpunpckhwd_avx2(auVar5,auVar4);
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar4 = vpunpcklwd_avx2(auVar5,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar8);
  auVar5 = vpmulhuw_avx2((undefined1  [32])alVar2,*(undefined1 (*) [32])(src0 + src0_stride));
  auVar7 = vpmullw_avx2((undefined1  [32])alVar2,*(undefined1 (*) [32])(src0 + src0_stride));
  auVar8 = vpunpckhwd_avx2(auVar7,auVar5);
  auVar9 = vpunpcklwd_avx2(auVar7,auVar5);
  auVar5 = vpmulhuw_avx2(auVar6,*(undefined1 (*) [32])(src1 + src1_stride));
  auVar7 = vpmullw_avx2(auVar6,*(undefined1 (*) [32])(src1 + src1_stride));
  alVar1 = *round_offset;
  auVar3 = vpsubd_avx2(auVar3,(undefined1  [32])alVar1);
  auVar3 = vpsrad_avx2(auVar3,ZEXT416((uint)shift));
  auVar6 = vpunpckhwd_avx2(auVar7,auVar5);
  auVar4 = vpsubd_avx2(auVar4,(undefined1  [32])alVar1);
  auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)shift));
  auVar7 = vpunpcklwd_avx2(auVar7,auVar5);
  auVar3 = vpackssdw_avx2(auVar4,auVar3);
  auVar4 = vpsubd_avx2(auVar8,(undefined1  [32])alVar1);
  auVar4 = vpaddd_avx2(auVar6,auVar4);
  auVar5 = vpsrad_avx2(auVar4,ZEXT416((uint)shift));
  auVar4 = vpsubd_avx2(auVar9,(undefined1  [32])alVar1);
  auVar4 = vpaddd_avx2(auVar4,auVar7);
  auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)shift));
  auVar4 = vpackssdw_avx2(auVar4,auVar5);
  auVar3 = vpmaxsw_avx2(auVar3,(undefined1  [32])*clip_low);
  auVar5 = vpminsw_avx2(auVar3,(undefined1  [32])*clip_high);
  auVar3 = vpmaxsw_avx2(auVar4,(undefined1  [32])*clip_low);
  auVar3 = vpminsw_avx2(auVar3,(undefined1  [32])*clip_high);
  *(undefined1 (*) [32])dst = auVar5;
  *(undefined1 (*) [32])(dst + dst_stride) = auVar3;
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_w16_avx2(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const __m256i *mask0a,
    const __m256i *mask0b, const __m256i *round_offset, int shift,
    const __m256i *clip_low, const __m256i *clip_high,
    const __m256i *mask_max) {
  // Load 16x pixels from each of 2 rows from each source
  const __m256i s0a = yy_loadu_256(src0);
  const __m256i s0b = yy_loadu_256(src0 + src0_stride);
  const __m256i s1a = yy_loadu_256(src1);
  const __m256i s1b = yy_loadu_256(src1 + src1_stride);

  // Calculate inverse masks
  const __m256i mask1a = _mm256_sub_epi16(*mask_max, *mask0a);
  const __m256i mask1b = _mm256_sub_epi16(*mask_max, *mask0b);

  // Multiply each source by appropriate mask
  const __m256i mul0a_highs = _mm256_mulhi_epu16(*mask0a, s0a);
  const __m256i mul0a_lows = _mm256_mullo_epi16(*mask0a, s0a);
  const __m256i mul0ah = _mm256_unpackhi_epi16(mul0a_lows, mul0a_highs);
  const __m256i mul0al = _mm256_unpacklo_epi16(mul0a_lows, mul0a_highs);
  // Note that AVX2 unpack orders 64-bit words as [3 1] [2 0] to keep within
  // lanes Later, packs does the same again which cancels this out with no need
  // for a permute.  The intermediate values being reordered makes no difference

  const __m256i mul1a_highs = _mm256_mulhi_epu16(mask1a, s1a);
  const __m256i mul1a_lows = _mm256_mullo_epi16(mask1a, s1a);
  const __m256i mul1ah = _mm256_unpackhi_epi16(mul1a_lows, mul1a_highs);
  const __m256i mul1al = _mm256_unpacklo_epi16(mul1a_lows, mul1a_highs);

  const __m256i mulah = _mm256_add_epi32(mul0ah, mul1ah);
  const __m256i mulal = _mm256_add_epi32(mul0al, mul1al);

  const __m256i mul0b_highs = _mm256_mulhi_epu16(*mask0b, s0b);
  const __m256i mul0b_lows = _mm256_mullo_epi16(*mask0b, s0b);
  const __m256i mul0bh = _mm256_unpackhi_epi16(mul0b_lows, mul0b_highs);
  const __m256i mul0bl = _mm256_unpacklo_epi16(mul0b_lows, mul0b_highs);

  const __m256i mul1b_highs = _mm256_mulhi_epu16(mask1b, s1b);
  const __m256i mul1b_lows = _mm256_mullo_epi16(mask1b, s1b);
  const __m256i mul1bh = _mm256_unpackhi_epi16(mul1b_lows, mul1b_highs);
  const __m256i mul1bl = _mm256_unpacklo_epi16(mul1b_lows, mul1b_highs);

  const __m256i mulbh = _mm256_add_epi32(mul0bh, mul1bh);
  const __m256i mulbl = _mm256_add_epi32(mul0bl, mul1bl);

  const __m256i resah =
      _mm256_srai_epi32(_mm256_sub_epi32(mulah, *round_offset), shift);
  const __m256i resal =
      _mm256_srai_epi32(_mm256_sub_epi32(mulal, *round_offset), shift);
  const __m256i resbh =
      _mm256_srai_epi32(_mm256_sub_epi32(mulbh, *round_offset), shift);
  const __m256i resbl =
      _mm256_srai_epi32(_mm256_sub_epi32(mulbl, *round_offset), shift);

  // Signed saturating pack from i32 to i16:
  const __m256i packa = _mm256_packs_epi32(resal, resah);
  const __m256i packb = _mm256_packs_epi32(resbl, resbh);

  // Clip the values to the valid range
  const __m256i clipa =
      _mm256_min_epi16(_mm256_max_epi16(packa, *clip_low), *clip_high);
  const __m256i clipb =
      _mm256_min_epi16(_mm256_max_epi16(packb, *clip_low), *clip_high);

  // Store 16 pixels
  yy_storeu_256(dst, clipa);
  yy_storeu_256(dst + dst_stride, clipb);
}